

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::delete_view(Group *this,View *v)

{
  undefined1 uVar1;
  uint uVar2;
  Code *pCVar3;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  View *local_18;
  View *v_local;
  Group *this_local;
  
  local_18 = v;
  v_local = (View *)this;
  uVar2 = (*(v->super_View).super__Object._vptr__Object[2])();
  if ((uVar2 & 1) == 0) {
    pCVar3 = core::P<r_code::Code>::operator->(&(local_18->super_View).object);
    (*(pCVar3->super__Object)._vptr__Object[4])(pCVar3,0);
    uVar1 = r_code::Atom::getDescriptor();
    switch(uVar1) {
    case 0xc3:
    case 0xc4:
      local_40 = View::get_oid(local_18);
      std::
      unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
      ::erase(&this->other_views,&local_40);
      break;
    case 200:
      local_48 = View::get_oid(local_18);
      std::
      unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
      ::erase(&this->group_views,&local_48);
      break;
    case 0xc9:
    case 0xca:
    case 0xcd:
    case 0xce:
    case 0xcf:
      local_28 = View::get_oid(local_18);
      std::
      unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
      ::erase(&this->ipgm_views,&local_28);
      break;
    case 0xcb:
      local_38 = View::get_oid(local_18);
      std::
      unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
      ::erase(&this->input_less_ipgm_views,&local_38);
      break;
    case 0xcc:
      local_30 = View::get_oid(local_18);
      std::
      unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
      ::erase(&this->anti_ipgm_views,&local_30);
    }
  }
  else {
    local_20 = View::get_oid(local_18);
    std::
    unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
    ::erase(&this->notification_views,&local_20);
  }
  return;
}

Assistant:

void Group::delete_view(View *v)
{
    if (v->isNotification()) {
        notification_views.erase(v->get_oid());
    } else switch (v->object->code(0).getDescriptor()) {
        case Atom::NULL_PROGRAM:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            ipgm_views.erase(v->get_oid());
            break;

        case Atom::INSTANTIATED_ANTI_PROGRAM:
            anti_ipgm_views.erase(v->get_oid());
            break;

        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            input_less_ipgm_views.erase(v->get_oid());
            break;

        case Atom::OBJECT:
        case Atom::MARKER:
            other_views.erase(v->get_oid());
            break;

        case Atom::GROUP:
            group_views.erase(v->get_oid());
            break;
        }
}